

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::Property::ParseProperty
               (vector<char,_std::allocator<char>_> *buffer,Property *pOut)

{
  bool bVar1;
  EDataType EVar2;
  ESemantic EVar3;
  Logger *this;
  reference __beg;
  reference pvVar4;
  reference __s;
  size_t sVar5;
  allocator<char> local_41;
  string local_40 [32];
  Property *local_20;
  Property *pOut_local;
  vector<char,_std::allocator<char>_> *buffer_local;
  
  local_20 = pOut;
  pOut_local = (Property *)buffer;
  bVar1 = std::vector<char,_std::allocator<char>_>::empty(buffer);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!buffer.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Ply/PlyParser.cpp"
                  ,0xf1,
                  "static bool Assimp::PLY::Property::ParseProperty(std::vector<char> &, PLY::Property *)"
                 );
  }
  bVar1 = DOM::SkipSpaces((vector<char,_std::allocator<char>_> *)pOut_local);
  if (bVar1) {
    bVar1 = DOM::TokenMatch((vector<char,_std::allocator<char>_> *)pOut_local,"property",8);
    if (bVar1) {
      bVar1 = DOM::SkipSpaces((vector<char,_std::allocator<char>_> *)pOut_local);
      if (bVar1) {
        bVar1 = DOM::TokenMatch((vector<char,_std::allocator<char>_> *)pOut_local,"list",4);
        if (bVar1) {
          local_20->bIsList = true;
          EVar2 = ParseDataType((vector<char,_std::allocator<char>_> *)pOut_local);
          local_20->eFirstType = EVar2;
          if (EVar2 == EDT_INVALID) {
            DOM::SkipLine((vector<char,_std::allocator<char>_> *)pOut_local);
            return false;
          }
          bVar1 = DOM::SkipSpaces((vector<char,_std::allocator<char>_> *)pOut_local);
          if (!bVar1) {
            return false;
          }
          EVar2 = ParseDataType((vector<char,_std::allocator<char>_> *)pOut_local);
          local_20->eType = EVar2;
          if (EVar2 == EDT_INVALID) {
            DOM::SkipLine((vector<char,_std::allocator<char>_> *)pOut_local);
            return false;
          }
        }
        else {
          EVar2 = ParseDataType((vector<char,_std::allocator<char>_> *)pOut_local);
          local_20->eType = EVar2;
          if (EVar2 == EDT_INVALID) {
            DOM::SkipLine((vector<char,_std::allocator<char>_> *)pOut_local);
            return false;
          }
        }
        bVar1 = DOM::SkipSpaces((vector<char,_std::allocator<char>_> *)pOut_local);
        if (bVar1) {
          EVar3 = ParseSemantic((vector<char,_std::allocator<char>_> *)pOut_local);
          local_20->Semantic = EVar3;
          if (local_20->Semantic == EST_INVALID) {
            this = DefaultLogger::get();
            Logger::info(this,"Found unknown semantic in PLY file. This is OK");
            __beg = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)pOut_local,0);
            pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)pOut_local,0);
            __s = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)pOut_local,0);
            sVar5 = strlen(__s);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<char*,void>(local_40,__beg,pvVar4 + sVar5,&local_41);
            std::__cxx11::string::~string(local_40);
            std::allocator<char>::~allocator(&local_41);
          }
          DOM::SkipSpacesAndLineEnd((vector<char,_std::allocator<char>_> *)pOut_local);
          buffer_local._7_1_ = true;
        }
        else {
          buffer_local._7_1_ = false;
        }
      }
      else {
        buffer_local._7_1_ = false;
      }
    }
    else {
      buffer_local._7_1_ = false;
    }
  }
  else {
    buffer_local._7_1_ = false;
  }
  return buffer_local._7_1_;
}

Assistant:

bool PLY::Property::ParseProperty(std::vector<char> &buffer, PLY::Property* pOut)
{
  ai_assert(!buffer.empty());

  // Forms supported:
  // "property float x"
  // "property list uchar int vertex_index"

  // skip leading spaces
  if (!PLY::DOM::SkipSpaces(buffer)) {
    return false;
  }

  // skip the "property" string at the beginning
  if (!PLY::DOM::TokenMatch(buffer, "property", 8))
  {
    // seems not to be a valid property entry
    return false;
  }
  // get next word
  if (!PLY::DOM::SkipSpaces(buffer)) {
    return false;
  }
  if (PLY::DOM::TokenMatch(buffer, "list", 4))
  {
    pOut->bIsList = true;

    // seems to be a list.
    if (EDT_INVALID == (pOut->eFirstType = PLY::Property::ParseDataType(buffer)))
    {
      // unable to parse list size data type
      PLY::DOM::SkipLine(buffer);
      return false;
    }
    if (!PLY::DOM::SkipSpaces(buffer))return false;
    if (EDT_INVALID == (pOut->eType = PLY::Property::ParseDataType(buffer)))
    {
      // unable to parse list data type
      PLY::DOM::SkipLine(buffer);
      return false;
    }
  }
  else
  {
    if (EDT_INVALID == (pOut->eType = PLY::Property::ParseDataType(buffer)))
    {
      // unable to parse data type. Skip the property
      PLY::DOM::SkipLine(buffer);
      return false;
    }
  }

  if (!PLY::DOM::SkipSpaces(buffer))
    return false;

  pOut->Semantic = PLY::Property::ParseSemantic(buffer);

  if (PLY::EST_INVALID == pOut->Semantic)
  {
    ASSIMP_LOG_INFO("Found unknown semantic in PLY file. This is OK");
    std::string(&buffer[0], &buffer[0] + strlen(&buffer[0]));
  }

  PLY::DOM::SkipSpacesAndLineEnd(buffer);
  return true;
}